

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::Decompose_LU(TPZBlockDiagonal<std::complex<float>_> *this)

{
  char cVar1;
  int iVar2;
  long rows;
  long lVar3;
  long lVar4;
  list<long,_std::allocator<long>_> singular;
  TPZFMatrix<std::complex<float>_> temp;
  
  cVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      return 1;
    }
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZBlockDiagonal<std::complex<float>>::Decompose_LU() [TVar = std::complex<float>]"
               ,"TPZBlockDiagonal::Decompose_LU is already decomposed with other scheme");
  }
  lVar3 = (this->fBlockSize).fNElements;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    iVar2 = (this->fBlockSize).fStore[lVar4];
    rows = (long)iVar2;
    if (rows != 0) {
      TPZFMatrix<std::complex<float>_>::TPZFMatrix
                (&temp,rows,rows,(this->fStorage).fStore + (this->fBlockPos).fStore[lVar4],
                 (ulong)(uint)(iVar2 * iVar2));
      singular.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
      singular.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&singular;
      singular.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
      _M_prev = (_List_node_base *)&singular;
      TPZFMatrix<std::complex<float>_>::Decompose_LU(&temp,&singular);
      std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
                ((_List_base<long,_std::allocator<long>_> *)&singular);
      TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&temp);
    }
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\x01';
  return 1;
}

Assistant:

int TPZBlockDiagonal<TVar>::Decompose_LU()
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZBlockDiagonal::Decompose_LU");
#endif
	
	if (  this->fDecomposed && this->fDecomposed == ELU) {
		return ELU;
	} else if(this->fDecomposed) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is already decomposed with other scheme");
	}
	
	int64_t b,nb,pos;
	int bsize;
	nb = fBlockSize.NElements();
	for(b=0;b<nb; b++) {
		pos = fBlockPos[b];
		bsize = fBlockSize[b];
		if(!bsize) continue;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream mess;
            mess << "TPZBlockDiagonal::Decompose_LU() - bsize = " << bsize << ", bsize*bsize = " << bsize*bsize;
            LOGPZ_DEBUG(logger,mess.str());
        }
#endif
		
		TPZFMatrix<TVar> temp(bsize,bsize,&fStorage[pos],bsize*bsize);
		std::list<int64_t> singular;
		temp.Decompose_LU(singular);
	}
	this->fDecomposed = ELU;
	return 1;
}